

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * integer_promotion(dmr_C *C,symbol *type)

{
  int width;
  unsigned_long mod;
  symbol *type_local;
  dmr_C *C_local;
  
  mod = (unsigned_long)type;
  if (((undefined1  [232])*type & (undefined1  [232])0xff) == (undefined1  [232])0xd) {
    mod = (unsigned_long)(type->field_14).field_2.ctype.base_type;
  }
  if ((type->field_14).field_1.normal < C->target->bits_in_int) {
    C_local = (dmr_C *)&C->S->int_ctype;
  }
  else if ((*(ulong *)(mod + 0x60) & 0x300) == 0) {
    C_local = (dmr_C *)mod;
  }
  else if ((*(ulong *)(mod + 0x60) & 0x80) == 0) {
    C_local = (dmr_C *)&C->S->int_ctype;
  }
  else {
    C_local = (dmr_C *)&C->S->uint_ctype;
  }
  return (symbol *)C_local;
}

Assistant:

static inline struct symbol *integer_promotion(struct dmr_C *C, struct symbol *type)
{
	unsigned long mod =  type->ctype.modifiers;
	int width = type->bit_size;

	/*
	 * Bitfields always promote to the base type,
	 * even if the bitfield might be bigger than
	 * an "int".
	 */
	if (type->type == SYM_BITFIELD) {
		type = type->ctype.base_type;
	}
	mod = type->ctype.modifiers;
	if (width < C->target->bits_in_int)
		return &C->S->int_ctype;

	/* If char/short has as many bits as int, it still gets "promoted" */
	if (mod & (MOD_CHAR | MOD_SHORT)) {
		if (mod & MOD_UNSIGNED)
			return &C->S->uint_ctype;
		return &C->S->int_ctype;
	}
	return type;
}